

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_unittest.cc
# Opt level: O0

void __thiscall
Crc32Hash_TestVectors_Test::Crc32Hash_TestVectors_Test(Crc32Hash_TestVectors_Test *this)

{
  Crc32Hash_TestVectors_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Crc32Hash_TestVectors_Test_001bc390;
  return;
}

Assistant:

TEST(Crc32Hash, TestVectors) {
  struct {
    const char *input;
    const char *result;
  } test[] = {
    { "123456789",
      "0xcbf43926" },
    { "1234",
      "0x9be3e0a3" },
  };
  
  uint32_t digest;
  for (int i = 0; i < sizeof(test)/sizeof(test[0]); i++) {
    digest = crc32(0, test[i].input, strlen(test[i].input));
    EXPECT_TRUE(IsEqual(test[i].input, digest, test[i].result));
  }

  // Testing partial digest
  digest = crc32(0, "1234", 4);
  digest = crc32(digest, "56789", 5);
  EXPECT_TRUE(IsEqual("'1234' + '56789'", digest, "0xcbf43926"));
}